

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O1

void __thiscall kratos::SortStmtVisitor::visit(SortStmtVisitor *this,Generator *top)

{
  StatementType SVar1;
  pointer psVar2;
  int iVar3;
  StmtException *pSVar4;
  InternalException *pIVar5;
  long lVar6;
  size_type __n;
  vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>> *pvVar7;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *__x;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __args;
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  undefined1 auStack_178 [8];
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  var_assignments;
  undefined1 auStack_158 [8];
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  module_inst_assignments;
  undefined1 auStack_138 [8];
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  combinational_assignments;
  undefined1 auStack_118 [8];
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  sequential_assignments;
  undefined1 auStack_f8 [8];
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  latch_assignments;
  vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>> *local_d8 [5];
  element_type *local_b0;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *local_a8;
  undefined1 local_a0 [8];
  shared_ptr<kratos::StmtBlock> block;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> stmts;
  shared_ptr<kratos::Stmt> local_68;
  undefined1 auStack_58 [8];
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> result;
  allocator_type local_31;
  
  __x = &top->stmts_;
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
         &block.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__x);
  lVar6 = 0;
  var_assignments.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_178 = (undefined1  [8])0x0;
  var_assignments.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  module_inst_assignments.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_158 = (undefined1  [8])0x0;
  module_inst_assignments.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  combinational_assignments.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_138 = (undefined1  [8])0x0;
  combinational_assignments.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sequential_assignments.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_118 = (undefined1  [8])0x0;
  sequential_assignments.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  latch_assignments.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_f8 = (undefined1  [8])0x0;
  latch_assignments.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8[0] = (vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                 *)auStack_178;
  local_d8[1] = (vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                 *)auStack_158;
  local_d8[2] = (vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                 *)auStack_f8;
  local_d8[3] = (vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                 *)auStack_138;
  local_d8[4] = (vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                 *)auStack_118;
  do {
    std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
    reserve(*(vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
              **)((long)local_d8 + lVar6),
            (long)stmts.
                  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  ._M_impl.super__Vector_impl_data._M_start -
            (long)block.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi >> 4);
    psVar2 = stmts.
             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x28);
  local_a8 = __x;
  if (block.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      stmts.
      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __args = block.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    do {
      SVar1 = ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
              &(__args._M_pi)->_vptr__Sp_counted_base)->_M_ptr->type_;
      pvVar7 = (vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                *)auStack_158;
      if (SVar1 == ModuleInstantiation) {
LAB_0022464b:
        std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
        emplace_back<std::shared_ptr<kratos::Stmt>const&>
                  (pvVar7,(shared_ptr<kratos::Stmt> *)__args._M_pi);
      }
      else {
        if (SVar1 != Block) {
          pvVar7 = (vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                    *)auStack_178;
          if (SVar1 != Assign) {
            pSVar4 = (StmtException *)__cxa_allocate_exception(0x10);
            stmts.
            super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)
                       &stmts.
                        super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       "Statement cannot be in the top level","");
            local_a0 = (undefined1  [8])
                       ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
                       &(__args._M_pi)->_vptr__Sp_counted_base)->_M_ptr;
            __l._M_len = 1;
            __l._M_array = (iterator)local_a0;
            std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                      ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58,__l
                       ,(allocator_type *)&local_b0);
            StmtException::StmtException
                      (pSVar4,(string *)
                              &stmts.
                               super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58);
            __cxa_throw(pSVar4,&StmtException::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_0022464b;
        }
        Stmt::as<kratos::StmtBlock>((Stmt *)local_a0);
        iVar3 = *(int *)&(((IRNode *)((long)local_a0 + 0xd0))->fn_name_ln).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        if (iVar3 == 5) {
          pvVar7 = (vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                    *)auStack_f8;
        }
        else {
          pvVar7 = (vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                    *)auStack_118;
          if (iVar3 != 1) {
            if (iVar3 != 0) {
              pSVar4 = (StmtException *)__cxa_allocate_exception(0x10);
              stmts.
              super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_68;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)
                         &stmts.
                          super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         "Unrecognized statement block in top level","");
              local_b0 = ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
                         &(__args._M_pi)->_vptr__Sp_counted_base)->_M_ptr;
              __l_00._M_len = 1;
              __l_00._M_array = (iterator)&local_b0;
              std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                        ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58,
                         __l_00,&local_31);
              StmtException::StmtException
                        (pSVar4,(string *)
                                &stmts.
                                 super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58);
              __cxa_throw(pSVar4,&StmtException::typeinfo,std::runtime_error::~runtime_error);
            }
            pvVar7 = (vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                      *)auStack_138;
          }
        }
        std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
        emplace_back<std::shared_ptr<kratos::Stmt>const&>
                  (pvVar7,(shared_ptr<kratos::Stmt> *)__args._M_pi);
        if (block.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     block.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
        }
      }
      __args._M_pi = __args._M_pi + 1;
    } while (__args._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar2);
  }
  iVar3 = 0;
  lVar6 = 0;
  do {
    iVar3 = iVar3 + (int)((ulong)((*(long **)((long)local_d8 + lVar6))[1] -
                                 **(long **)((long)local_d8 + lVar6)) >> 4);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x28);
  __n = (long)stmts.
              super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
              ._M_impl.super__Vector_impl_data._M_start -
        (long)block.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi >> 4;
  if (__n != (long)iVar3) {
    pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
    stmts.
    super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &stmts.
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "Unable to sort all the statements","");
    InternalException::InternalException
              (pIVar5,(string *)
                      &stmts.
                       super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __cxa_throw(pIVar5,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  auStack_58 = (undefined1  [8])0x0;
  result.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  reserve((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          auStack_58,__n);
  lVar6 = 0;
  do {
    std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Stmt>*,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>>>
              ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                *)auStack_58,
               result.
               super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               ._M_impl.super__Vector_impl_data._M_start,**(undefined8 **)((long)local_d8 + lVar6),
               (*(undefined8 **)((long)local_d8 + lVar6))[1]);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x28);
  if ((long)result.
            super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
            ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 !=
      (long)stmts.
            super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
            ._M_impl.super__Vector_impl_data._M_start -
      (long)block.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi) {
    pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
    stmts.
    super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &stmts.
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "Unable to sort all the statements","");
    InternalException::InternalException
              (pIVar5,(string *)
                      &stmts.
                       super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __cxa_throw(pIVar5,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  operator=(local_a8,(vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                      *)auStack_58);
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          auStack_58);
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          auStack_f8);
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          auStack_118);
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          auStack_138);
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          auStack_158);
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          auStack_178);
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          &block.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void visit(Generator* top) override {
        auto stmts = top->get_all_stmts();
        std::vector<std::shared_ptr<Stmt>> var_assignments;
        std::vector<std::shared_ptr<Stmt>> module_inst_assignments;
        std::vector<std::shared_ptr<Stmt>> combinational_assignments;
        std::vector<std::shared_ptr<Stmt>> sequential_assignments;
        std::vector<std::shared_ptr<Stmt>> latch_assignments;
        auto lists = {&var_assignments, &module_inst_assignments, &latch_assignments,
                      &combinational_assignments, &sequential_assignments};
        for (auto* assign : lists) assign->reserve(stmts.size());

        for (auto const& stmt : stmts) {
            if (stmt->type() == StatementType::Assign) {
                var_assignments.emplace_back(stmt);
            } else if (stmt->type() == StatementType::Block) {
                auto block = stmt->as<StmtBlock>();
                if (block->block_type() == StatementBlockType::Combinational) {
                    combinational_assignments.emplace_back(stmt);
                } else if (block->block_type() == StatementBlockType::Sequential) {
                    sequential_assignments.emplace_back(stmt);
                } else if (block->block_type() == StatementBlockType::Latch) {
                    latch_assignments.emplace_back(stmt);
                } else {
                    throw StmtException("Unrecognized statement block in top level", {stmt.get()});
                }
            } else if (stmt->type() == StatementType::ModuleInstantiation) {
                module_inst_assignments.emplace_back(stmt);
            } else {
                throw StmtException("Statement cannot be in the top level", {stmt.get()});
            }
        }

        uint64_t size = std::accumulate(lists.begin(), lists.end(), 0,
                                        [](uint64_t s, auto lst) { return s + lst->size(); });
        if (size != stmts.size()) throw InternalException("Unable to sort all the statements");
        std::vector<std::shared_ptr<Stmt>> result;
        result.reserve(stmts.size());
        for (auto* assign : lists) result.insert(result.end(), assign->begin(), assign->end());
        if (result.size() != stmts.size())
            throw InternalException("Unable to sort all the statements");
        top->set_stmts(result);
    }